

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

void helicsFederateInfoSetIntegerProperty
               (HelicsFederateInfo fedInfo,int integerProperty,int propertyValue,HelicsError *err)

{
  FederateInfo *pFVar1;
  int local_18;
  int local_14;
  
  pFVar1 = getFedInfo(fedInfo,err);
  if (pFVar1 != (FederateInfo *)0x0) {
    _local_18 = CONCAT44(integerProperty,propertyValue);
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               &(pFVar1->super_CoreFederateInfo).intProps,&local_14,&local_18);
  }
  return;
}

Assistant:

void helicsFederateInfoSetIntegerProperty(HelicsFederateInfo fedInfo, int integerProperty, int propertyValue, HelicsError* err)
{
    auto* info = getFedInfo(fedInfo, err);
    if (info == nullptr) {
        return;
    }
    info->setProperty(integerProperty, propertyValue);
}